

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O2

bool __thiscall cursespp::ListOverlay::KeyPress(ListOverlay *this,string *key)

{
  bool bVar1;
  size_t index;
  unsigned_long __args_2;
  ListWindow *sender;
  __shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->keyInterceptorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__cxx11::string::string((string *)&local_48,(string *)key);
    bVar1 = std::
            function<bool_(cursespp::ListOverlay_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            ::operator()(&this->keyInterceptorCallback,this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = std::operator==(key,"^[");
  if (bVar1) {
    OverlayBase::Dismiss(&this->super_OverlayBase);
  }
  else {
    sender = (ListWindow *)0x1a0549;
    bVar1 = std::operator==(key," ");
    if (bVar1) {
      index = (**(code **)(*(long *)&(((this->listWindow).
                                       super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ListWindow).super_ScrollableWindow.
                                     super_Window.super_IWindow.super_IOrderable + 0x228))();
      OnListEntryActivated(this,sender,index);
    }
    else {
      bVar1 = std::operator==(key,"KEY_BACKSPACE");
      if (((!bVar1) && (bVar1 = std::operator==(key,"KEY_DC"), !bVar1)) ||
         ((this->deleteKeyCallback).super__Function_base._M_manager == (_Manager_type)0x0)) {
        bVar1 = LayoutBase::KeyPress((LayoutBase *)this,key);
        return bVar1;
      }
      std::__shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&_Stack_58,
                 &(this->adapter).
                  super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>);
      __args_2 = (**(code **)(*(long *)&(((this->listWindow).
                                          super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ListWindow).super_ScrollableWindow.
                                        super_Window.super_IWindow.super_IOrderable + 0x228))();
      std::
      function<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long)>
      ::operator()(&this->deleteKeyCallback,this,(shared_ptr<cursespp::IScrollAdapter> *)&_Stack_58,
                   __args_2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
    }
  }
  return true;
}

Assistant:

bool ListOverlay::KeyPress(const std::string& key) {
    if (keyInterceptorCallback && keyInterceptorCallback(this, key)) {
        return true;
    }
    else if (key == "^[") { /* esc closes */
        this->Dismiss();
        return true;
    }
    else if (key == " ") { /* space bar also toggles activation */
        this->OnListEntryActivated(
            this->listWindow.get(),
            this->listWindow->GetSelectedIndex());
        return true;
    }
    else if (key == "KEY_BACKSPACE" || key == "KEY_DC") {
        if (deleteKeyCallback) {
            deleteKeyCallback(
                this,
                this->adapter,
                listWindow->GetSelectedIndex());

            return true;
        }
    }

    return LayoutBase::KeyPress(key);
}